

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

int Saig_ManFilterUsingIndOne_new
              (Aig_Man_t *p,Aig_Man_t *pFrame,sat_solver *pSat,Cnf_Dat_t *pCnf,int nConfs,int nProps
              ,int Counter)

{
  int iVar1;
  int Lit;
  int local_4;
  
  if ((-1 < Counter) && (Counter < pFrame->vCos->nSize)) {
    local_4 = pCnf->pVarNums[*(int *)((long)pFrame->vCos->pArray[(uint)Counter] + 0x24)] * 2;
    iVar1 = sat_solver_solve(pSat,&local_4,(lit *)&stack0x00000000,(long)nConfs,0,0,0);
    if (iVar1 + 1U < 3) {
      return *(int *)(&DAT_00a1c618 + (ulong)(iVar1 + 1U) * 4);
    }
    __assert_fail("status == l_True",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigConstr2.c"
                  ,0x146,
                  "int Saig_ManFilterUsingIndOne_new(Aig_Man_t *, Aig_Man_t *, sat_solver *, Cnf_Dat_t *, int, int, int)"
                 );
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManFilterUsingIndOne_new( Aig_Man_t * p, Aig_Man_t * pFrame, sat_solver * pSat, Cnf_Dat_t * pCnf, int nConfs, int nProps, int Counter )
{
    Aig_Obj_t * pObj;
    int Lit, status;
    pObj = Aig_ManCo( pFrame, Counter );
    Lit  = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
    status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfs, 0, 0, 0 );
    if ( status == l_False )
        return 1;
    if ( status == l_Undef )
    {
//        printf( "Solver returned undecided.\n" );
        return 0;
    }
    assert( status == l_True );
    return 0;
}